

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_std.h
# Opt level: O2

void __thiscall Person::~Person(Person *this)

{
  std::__cxx11::string::~string((string *)&this->_last);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

bool operator==(const Person &o) const
    { 
        return _first == o._first && _last == o._last && _age == o._age; 
    }